

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_TeamCityOutputTest_PrintWithEscapedCharacters_Test::testBody
          (TEST_TeamCityOutputTest_PrintWithEscapedCharacters_Test *this)

{
  TeamCityTestOutput *pTVar1;
  UtestShell *pUVar2;
  SimpleString *this_00;
  char *pcVar3;
  TestTerminator *pTVar4;
  char *expected;
  TEST_TeamCityOutputTest_PrintWithEscapedCharacters_Test *this_local;
  
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).tcout;
  (*(pTVar1->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xf])
            (pTVar1,(this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).f3);
  pUVar2 = UtestShell::getCurrent();
  this_00 = TeamCityOutputToBuffer::getOutput
                      ((this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).mock);
  pcVar3 = SimpleString::asCharString(this_00);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,
             "##teamcity[testFailed name=\'test\' message=\'file:30\' details=\'apos|\' pipe|| |[brackets|]|r|nCRLF\']\n"
             ,pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
             ,0x97,pTVar4);
  return;
}

Assistant:

TEST(TeamCityOutputTest, PrintWithEscapedCharacters)
{
    tcout->printFailure(*f3);
    const char* expected =
            "##teamcity[testFailed name='test' message='file:30' "
            "details='apos|' pipe|| |[brackets|]"
            "|r|nCRLF']\n";
    STRCMP_EQUAL(expected, mock->getOutput().asCharString());
}